

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

slot_type * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
::soo_slot(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
           *this)

{
  bool bVar1;
  
  bVar1 = is_soo(this);
  if (bVar1) {
    return (slot_type *)
           &(this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_;
  }
  __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x101f,
                "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::soo_slot() [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
               );
}

Assistant:

slot_type* soo_slot() {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return static_cast<slot_type*>(common().soo_data());
  }